

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects-info.c
# Opt level: O2

size_t effect_get_menu_name(char *buf,size_t max,effect *e)

{
  ushort uVar1;
  int iVar2;
  uint uVar3;
  wchar_t wVar4;
  size_t sVar5;
  obj_property *poVar6;
  char *pcVar7;
  char *pcVar8;
  char *fmt;
  char *pcVar9;
  bool bVar10;
  bool bVar11;
  random_value value;
  char dist [32];
  
  if ((e == (effect *)0x0) || (uVar1 = e->index, (ushort)(uVar1 - 0x80) < 0xff81)) {
    return 0;
  }
  if (0x13 < (uint)base_descs[uVar1].efinfo_flag) {
    sVar5 = strnfmt(buf,max,"%s","");
    msg("Bad effect description passed to effect_get_menu_name().  Please report this bug.");
    return sVar5;
  }
  fmt = base_descs[uVar1].menu_name;
  switch(base_descs[uVar1].efinfo_flag) {
  default:
    pcVar8 = fmt;
    fmt = "%s";
    break;
  case 4:
    switch(e->subtype) {
    case L'\0':
      pcVar9 = "yourself";
      pcVar8 = "feed";
      goto LAB_0014218f;
    case L'\x01':
      pcVar9 = "hunger";
      pcVar8 = "increase";
      goto LAB_0014218f;
    case L'\x02':
      if (e->dice == (dice_t *)0x0) {
        wVar4 = L'\0';
      }
      else {
        wVar4 = dice_evaluate(e->dice,1,AVERAGE,(random_value *)0x0);
      }
      pcVar8 = "become";
      if (PY_FOOD_FULL < wVar4) {
LAB_0014216b:
        pcVar9 = "bloated";
        goto LAB_0014218f;
      }
      bVar11 = SBORROW4(wVar4,PY_FOOD_HUNGRY);
      iVar2 = wVar4 - PY_FOOD_HUNGRY;
      bVar10 = wVar4 == PY_FOOD_HUNGRY;
      pcVar7 = "satisfied";
      break;
    case L'\x03':
      if (e->dice == (dice_t *)0x0) {
        wVar4 = L'\0';
      }
      else {
        wVar4 = dice_evaluate(e->dice,1,AVERAGE,(random_value *)0x0);
      }
      pcVar8 = "leave";
      if (PY_FOOD_FULL < wVar4) goto LAB_0014216b;
      bVar11 = SBORROW4(wVar4,PY_FOOD_HUNGRY);
      iVar2 = wVar4 - PY_FOOD_HUNGRY;
      bVar10 = wVar4 == PY_FOOD_HUNGRY;
      pcVar7 = "nourished";
      break;
    default:
      fmt = "%s";
      pcVar8 = "";
      goto LAB_00142078;
    }
    pcVar9 = "hungry";
    if (!bVar10 && bVar11 == iVar2 < 0) {
      pcVar9 = pcVar7;
    }
LAB_0014218f:
    sVar5 = strnfmt(buf,max,fmt,pcVar8,pcVar9);
    return sVar5;
  case 5:
  case 6:
    pcVar8 = timed_effects[e->subtype].desc;
    break;
  case 7:
    poVar6 = lookup_obj_property(L'\x01',e->subtype);
    pcVar8 = poVar6->name;
    break;
  case 8:
  case 0x11:
  case 0x12:
  case 0x13:
    pcVar8 = projections[e->subtype].desc;
    break;
  case 9:
    pcVar8 = summon_desc(e->subtype);
    break;
  case 10:
    value.base = 0;
    value.dice = 0;
    value.sides = 0;
    value.m_bonus = 0;
    if (e->dice == (dice_t *)0x0) {
      uVar3 = 0;
    }
    else {
      uVar3 = dice_evaluate(e->dice,1,AVERAGE,&value);
      if (value.m_bonus != 0) {
        strnfmt(dist,0x20,"some distance");
        goto LAB_001420a6;
      }
    }
    strnfmt(dist,0x20,"%d grids",(ulong)uVar3);
LAB_001420a6:
    pcVar8 = "other";
    if (e->subtype == L'\0') {
      pcVar8 = "you";
    }
    sVar5 = strnfmt(buf,max,fmt,pcVar8,dist);
    return sVar5;
  case 0xc:
  case 0xd:
  case 0xe:
  case 0xf:
    pcVar8 = projections[e->subtype].player_desc;
    break;
  case 0x10:
    pcVar8 = projections[e->subtype].lash_desc;
  }
LAB_00142078:
  sVar5 = strnfmt(buf,max,fmt,pcVar8);
  return sVar5;
}

Assistant:

size_t effect_get_menu_name(char *buf, size_t max, const struct effect *e)
{
	const char *fmt;
	size_t len;

	if (!e || e->index <= EF_NONE || e->index >= EF_MAX) {
		return 0;
	}

	fmt = base_descs[e->index].menu_name;
	switch (base_descs[e->index].efinfo_flag) {
	case EFINFO_DICE:
	case EFINFO_HEAL:
	case EFINFO_CONST:
	case EFINFO_QUAKE:
	case EFINFO_NONE:
		len = strnfmt(buf, max, "%s", fmt);
		break;

	case EFINFO_FOOD:
		{
			const char *actstr;
			const char *actarg;
			int avg;

			switch (e->subtype) {
			case 0: /* INC_BY */
				actstr = "feed";
				actarg = "yourself";
				break;
			case 1: /* DEC_BY */
				actstr = "increase";
				actarg = "hunger";
				break;
			case 2: /* SET_TO */
				avg = (e->dice) ?
					dice_evaluate(e->dice, 1, AVERAGE, NULL) : 0;
				actstr = "become";
				if (avg > PY_FOOD_FULL) {
					actarg = "bloated";
				} else if (avg > PY_FOOD_HUNGRY) {
					actarg = "satisfied";
				} else {
					actarg = "hungry";
				}
				break;
			case 3: /* INC_TO */
				avg = (e->dice) ?
					dice_evaluate(e->dice, 1, AVERAGE, NULL): 0;
				actstr = "leave";
				if (avg > PY_FOOD_FULL) {
					actarg = "bloated";
				} else if (avg > PY_FOOD_HUNGRY) {
					actarg = "nourished";
				} else {
					actarg = "hungry";
				}
				break;
			default:
				actstr = NULL;
				actarg = NULL;
				break;
			}
			if (actstr && actarg) {
				len = strnfmt(buf, max, fmt, actstr, actarg);
			} else {
				len = strnfmt(buf, max, "%s", "");
			}
		}
		break;

	case EFINFO_CURE:
	case EFINFO_TIMED:
		len = strnfmt(buf, max, fmt, timed_effects[e->subtype].desc);
		break;

	case EFINFO_STAT:
		len = strnfmt(buf, max, fmt,
			lookup_obj_property(OBJ_PROPERTY_STAT,
			e->subtype)->name);
		break;

	case EFINFO_SEEN:
	case EFINFO_BOLT:
	case EFINFO_BOLTD:
	case EFINFO_TOUCH:
		len = strnfmt(buf, max, fmt, projections[e->subtype].desc);
		break;

	case EFINFO_SUMM:
		len = strnfmt(buf, max, fmt, summon_desc(e->subtype));
		break;

	case EFINFO_TELE:
		{
			random_value value = { 0, 0, 0, 0 };
			char dist[32];
			int avg = 0;

			if (e->dice) {
				avg = dice_evaluate(e->dice, 1, AVERAGE,
					&value);
			}
			if (value.m_bonus) {
				strnfmt(dist, sizeof(dist), "some distance");
			} else {
				strnfmt(dist, sizeof(dist), "%d grids", avg);
			}
			len = strnfmt(buf, max, fmt,
				(e->subtype) ? "other" : "you", dist);
		}
		break;

	case EFINFO_BALL:
	case EFINFO_SPOT:
	case EFINFO_BREATH:
	case EFINFO_SHORT:
		len = strnfmt(buf, max, fmt,
			projections[e->subtype].player_desc);
		break;

	case EFINFO_LASH:
		len = strnfmt(buf, max, fmt, projections[e->subtype].lash_desc);
		break;

	default:
		len = strnfmt(buf, max, "%s", "");
		msg("Bad effect description passed to effect_get_menu_name().  Please report this bug.");
		break;
	}

	return len;
}